

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O2

shared_ptr<libtorrent::torrent_plugin>
libtorrent::create_ut_metadata_plugin(torrent_handle *th,client_data_t param_2)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<libtorrent::torrent_plugin> sVar3;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::ut_metadata_plugin,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_48;
  undefined8 local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  torrent_handle::native_handle((torrent_handle *)&local_48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_48._M_ptr);
  if ((**(int **)(local_48._M_alloc + 0x18) < 1) ||
     ((*(byte *)(*(int **)(local_48._M_alloc + 0x18) + 0x9b) & 2) == 0)) {
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
    p_Var1->_M_use_count = 1;
    p_Var1->_M_weak_count = 1;
    p_Var1->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004d1a18;
    p_Var1[1]._vptr__Sp_counted_base = (_func_int **)&PTR__ut_metadata_plugin_004d1a68;
    *(allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::ut_metadata_plugin,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin>,_(__gnu_cxx::_Lock_policy)2>_>
      **)&p_Var1[1]._M_use_count = local_48._M_alloc;
    p_Var1[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var1[3]._M_use_count = 0;
    p_Var1[3]._M_weak_count = 0;
    p_Var1[4]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var1[4]._M_use_count = 0;
    p_Var1[4]._M_weak_count = 0;
    p_Var1[2]._vptr__Sp_counted_base = (_func_int **)0x0;
    p_Var1[2]._M_use_count = 0;
    p_Var1[2]._M_weak_count = 0;
    local_48._M_ptr = (pointer)0x0;
    local_48._M_alloc = &__a2;
    ::std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::ut_metadata_plugin,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr(&local_48);
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(p_Var1 + 1);
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var1;
    local_38 = 0;
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)th;
  return (shared_ptr<libtorrent::torrent_plugin>)
         sVar3.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_plugin> create_ut_metadata_plugin(torrent_handle const& th, client_data_t)
	{
		aux::torrent* t = th.native_handle().get();
		// don't add this extension if the torrent is private
		if (t->valid_metadata() && t->torrent_file().priv()) return {};
		return std::make_shared<ut_metadata_plugin>(*t);
	}